

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DoubleElement.cpp
# Opt level: O3

ssize_t __thiscall DoubleElement::read(DoubleElement *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 in_register_00000034;
  double dVar4;
  string tmpStr;
  string local_80;
  string local_60;
  char *local_40;
  undefined8 local_38;
  char local_30;
  undefined7 uStack_2f;
  
  local_38 = 0;
  local_30 = '\0';
  local_40 = &local_30;
  std::operator>>((istream *)CONCAT44(in_register_00000034,__fd),(string *)&local_40);
  dVar4 = atof(local_40);
  iVar1 = std::__cxx11::string::compare((char *)&local_40);
  if (dVar4 != 0.0 || iVar1 == 0) {
    this->_value = dVar4;
    Object::setInitState(&(this->super_StreamObject).super_Object,true);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error (DoubleElement): Entry ",0x1d);
    iVar2 = StreamObject::getOffset(&this->super_StreamObject);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2 + 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," in \"<",6);
    StreamObject::getParentName_abi_cxx11_(&local_60,&this->super_StreamObject);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"></",3);
    StreamObject::getParentName_abi_cxx11_(&local_80,&this->super_StreamObject);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_80._M_dataplus._M_p,local_80._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,">\" - Section is not a valid double number!\n",0x2b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_40 != &local_30) {
    operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
  }
  return CONCAT71((int7)((ulong)&local_40 >> 8),dVar4 != 0.0 || iVar1 == 0) & 0xffffffff;
}

Assistant:

bool DoubleElement::read( std::stringstream &f )
{
	/*-----------------------------------------
		   Read real number
	------------------------------------------*/
	std::string tmpStr;
	f >> tmpStr;


	double tmpVal = atof( tmpStr.c_str() );
	if (( tmpStr != "0" ) && ( tmpVal == 0 ) )
	{
		std::cerr << "Error (DoubleElement): Entry " << getOffset() + 1 << " in \"<"
		<< getParentName() << "></" << getParentName() << ">\" - Section is not a valid double number!\n";
		return false;
	}
	_value = tmpVal;

	setInitState( true );

	return true;

}